

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

uint rf_gfx_load_texture_cubemap(void *data,int size,rf_pixel_format format)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  rf_gfx_pixel_format rVar5;
  uint cubemap_id;
  int swizzle_mask [4];
  
  cubemap_id = 0;
  iVar2 = rf_bytes_per_pixel(format);
  (*(rf__ctx->field_0).gfx_ctx.gl.GenTextures)(1,&cubemap_id);
  (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)(0x8513,cubemap_id);
  rVar5 = rf_gfx_get_internal_texture_formats(format);
  if ((rVar5._8_8_ >> 0x20 & 1) != 0) {
    iVar2 = size * size * iVar2;
    uVar4 = 0;
    for (lVar3 = -6; lVar3 != 0; lVar3 = lVar3 + 1) {
      uVar1 = (int)lVar3 + 0x851b;
      if (format - RF_UNCOMPRESSED_GRAYSCALE < 10) {
        (*(rf__ctx->field_0).gfx_ctx.gl.TexImage2D)
                  (uVar1,0,rVar5.internal_format,size,size,0,rVar5.format,rVar5.type,
                   (void *)(uVar4 + (long)data));
      }
      else {
        (*(rf__ctx->field_0).gfx_ctx.gl.CompressedTexImage2D)
                  (uVar1,0,rVar5.internal_format,size,size,0,iVar2,(void *)(uVar4 + (long)data));
      }
      if (format == RF_UNCOMPRESSED_GRAY_ALPHA) {
        swizzle_mask[3] = 0x1904;
LAB_0012f57f:
        swizzle_mask[0] = 0x1903;
        swizzle_mask[1] = 0x1903;
        swizzle_mask[2] = 0x1903;
        (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteriv)(0x8513,0x8e46,swizzle_mask);
      }
      else if (format == RF_UNCOMPRESSED_GRAYSCALE) {
        swizzle_mask[3] = 1;
        goto LAB_0012f57f;
      }
      uVar4 = (ulong)(uint)((int)uVar4 + iVar2);
    }
  }
  (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0x8513,0x2801,0x2601);
  (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0x8513,0x2800,0x2601);
  (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0x8513,0x2802,0x812f);
  (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0x8513,0x2803,0x812f);
  (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0x8513,0x8072,0x812f);
  (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)(0x8513,0);
  return cubemap_id;
}

Assistant:

RF_API unsigned int rf_gfx_load_texture_cubemap(void* data, int size, rf_pixel_format format)
{
    unsigned int cubemap_id = 0;
    unsigned int data_size = size * size * rf_bytes_per_pixel(format);

    rf_gl.GenTextures(1, &cubemap_id);
    rf_gl.BindTexture(GL_TEXTURE_CUBE_MAP, cubemap_id);

    rf_gfx_pixel_format glformat = rf_gfx_get_internal_texture_formats(format);

    if (glformat.valid)
    {
        // Load cubemap faces
        for (unsigned int i = 0; i < 6; i++)
        {
            if (rf_is_uncompressed_format(format)) rf_gl.TexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X + i, 0, glformat.internal_format, size, size, 0, glformat.format, glformat.type, (unsigned char* )data + i * data_size);
            else rf_gl.CompressedTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X + i, 0, glformat.internal_format, size, size, 0, data_size, (unsigned char* )data + i*data_size);

            #if defined(RAYFORK_GRAPHICS_BACKEND_GL_33)
                if (format == RF_UNCOMPRESSED_GRAYSCALE)
                {
                    int swizzle_mask[] = { GL_RED, GL_RED, GL_RED, GL_ONE };
                    rf_gl.TexParameteriv(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_SWIZZLE_RGBA, swizzle_mask);
                }
                else if (format == RF_UNCOMPRESSED_GRAY_ALPHA)
                {
                    int swizzle_mask[] = { GL_RED, GL_RED, GL_RED, GL_GREEN };
                    rf_gl.TexParameteriv(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_SWIZZLE_RGBA, swizzle_mask);
                }
            #endif
        }
    }

    // Set cubemap texture sampling parameters
    rf_gl.TexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
    rf_gl.TexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    rf_gl.TexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    rf_gl.TexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
    #if defined(RAYFORK_GRAPHICS_BACKEND_GL_33)
    rf_gl.TexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);  // Flag not supported on OpenGL ES 2.0
    #endif // defined(RAYFORK_GRAPHICS_BACKEND_GL_33)

    rf_gl.BindTexture(GL_TEXTURE_CUBE_MAP, 0);

    return cubemap_id;
}